

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlStrncmp(xmlChar *str1,xmlChar *str2,int len)

{
  byte *pbVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),len < 1);
  if (str1 != str2 && len >= 1) {
    if (str1 == (xmlChar *)0x0) {
      return -1;
    }
    if (str2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar4 = 0;
    do {
      pbVar1 = str2 + lVar4;
      bVar2 = false;
      uVar5 = (uint)str1[lVar4] - (uint)*pbVar1;
      if (uVar5 == 0) {
        len = len + -1;
        if (len == 0) {
          len = 0;
          goto LAB_0015e01c;
        }
        bVar2 = true;
      }
      else {
LAB_0015e01c:
        uVar3 = (ulong)uVar5;
      }
      if (!bVar2) {
        return (int)uVar3;
      }
      lVar4 = lVar4 + 1;
    } while (*pbVar1 != 0);
  }
  return 0;
}

Assistant:

int
xmlStrncmp(const xmlChar *str1, const xmlChar *str2, int len) {
    if (len <= 0) return(0);
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strncmp((const char *)str1, (const char *)str2, len));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0 || --len == 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}